

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

xmlParserInputPtr xmlNewInputFromMemory(char *url,void *mem,size_t size,int flags)

{
  xmlParserInputBufferPtr buf;
  xmlParserInputPtr pxVar1;
  
  if (mem != (void *)0x0) {
    buf = xmlNewInputBufferMemory(mem,size,flags,XML_CHAR_ENCODING_NONE);
    if (buf != (xmlParserInputBufferPtr)0x0) {
      pxVar1 = xmlNewInputInternal(buf,url);
      return pxVar1;
    }
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

xmlParserInputPtr
xmlNewInputFromMemory(const char *url, const void *mem, size_t size,
                      int flags) {
    xmlParserInputBufferPtr buf;

    if (mem == NULL)
	return(NULL);

    buf = xmlNewInputBufferMemory(mem, size, flags, XML_CHAR_ENCODING_NONE);
    if (buf == NULL)
        return(NULL);

    return(xmlNewInputInternal(buf, url));
}